

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acknowledge_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Acknowledge_PDU::Acknowledge_PDU
          (Acknowledge_PDU *this,Simulation_Management_Header *SimMgrHeader,AcknowledgeFlag AF,
          AcknowledgeResponseFlag ARF,KUINT32 RequestID)

{
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header,SimMgrHeader);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Acknowledge_PDU_00223360;
  this->m_ui16AcknowledgeFlag = (KUINT16)AF;
  this->m_ui16ResponseFlag = (KUINT16)ARF;
  this->m_ui32RequestID = RequestID;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\x0f';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x20;
  return;
}

Assistant:

Acknowledge_PDU::Acknowledge_PDU( const Simulation_Management_Header & SimMgrHeader, AcknowledgeFlag AF,
                                  AcknowledgeResponseFlag ARF, KUINT32 RequestID ) :
    Simulation_Management_Header( SimMgrHeader ),
    m_ui16AcknowledgeFlag( AF ),
    m_ui16ResponseFlag( ARF ),
    m_ui32RequestID( RequestID )
{
    m_ui8PDUType = Acknowledge_PDU_Type;
    m_ui16PDULength = ACKNOWLEDGE_PDU_SIZE;
}